

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O1

void P_VavoomSlope(sector_t_conflict *sec,int id,DVector3 *pos,int which)

{
  line_t_conflict *plVar1;
  splane *psVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (0 < (long)sec->linecount) {
    lVar3 = 0;
    do {
      plVar1 = sec->lines[lVar3];
      if (plVar1->args[0] == id) {
        lVar3 = 0xd8;
        if (which == 0) {
          lVar3 = 0xb0;
        }
        psVar2 = sec->planes + 1;
        if (which == 0) {
          psVar2 = sec->planes;
        }
        dVar5 = pos->X - (plVar1->v2->p).X;
        dVar6 = pos->Y - (plVar1->v2->p).Y;
        dVar8 = pos->Z - psVar2->TexZ;
        dVar4 = pos->X - (plVar1->v1->p).X;
        dVar7 = pos->Y - (plVar1->v1->p).Y;
        dVar9 = dVar6 * dVar8 - dVar8 * dVar7;
        dVar8 = dVar8 * dVar4 - dVar5 * dVar8;
        dVar5 = dVar7 * dVar5 - dVar4 * dVar6;
        dVar4 = c_sqrt(dVar5 * dVar5 + dVar8 * dVar8 + dVar9 * dVar9);
        if ((dVar4 == 0.0) && (!NAN(dVar4))) {
          Printf("Slope thing at (%f,%f) lies directly on its target line.\n",pos->X,pos->Y);
          return;
        }
        dVar4 = 1.0 / dVar4;
        dVar9 = dVar9 * dVar4;
        dVar8 = dVar8 * dVar4;
        dVar4 = dVar4 * dVar5;
        if (((which == 0) && (dVar4 < 0.0)) || ((which == 1 && (0.0 < dVar4)))) {
          dVar9 = -dVar9;
          dVar8 = -dVar8;
          dVar4 = -dVar4;
        }
        dVar5 = pos->X;
        dVar6 = pos->Y;
        dVar7 = pos->Z;
        *(double *)((long)&sec->planes[0].xform.xOffs + lVar3) = dVar9;
        *(double *)((long)&sec->planes[0].xform.yOffs + lVar3) = dVar8;
        *(double *)((long)&sec->planes[0].xform.baseyOffs + lVar3) = dVar4;
        *(double *)((long)&sec->planes[0].xform.xScale + lVar3) =
             (-dVar9 * dVar5 - dVar6 * dVar8) - dVar7 * dVar4;
        *(double *)((long)&sec->planes[0].xform.yScale + lVar3) = -1.0 / dVar4;
        return;
      }
      lVar3 = lVar3 + 1;
    } while (sec->linecount != lVar3);
  }
  return;
}

Assistant:

void P_VavoomSlope(sector_t * sec, int id, const DVector3 &pos, int which)
{
	for (int i=0;i<sec->linecount;i++)
	{
		line_t * l=sec->lines[i];

		if (l->args[0]==id)
		{
			DVector3 v1, v2, cross;
			secplane_t *srcplane = (which == 0) ? &sec->floorplane : &sec->ceilingplane;
			double srcheight = (which == 0) ? sec->GetPlaneTexZ(sector_t::floor) : sec->GetPlaneTexZ(sector_t::ceiling);

			v1[0] = pos.X - l->v2->fX();
			v1[1] = pos.Y - l->v2->fY();
			v1[2] = pos.Z - srcheight;
			
			v2[0] = pos.X - l->v1->fX();
			v2[1] = pos.Y - l->v1->fY();
			v2[2] = pos.Z - srcheight;

			cross = v1 ^ v2;
			double len = cross.Length();
			if (len == 0)
			{
				Printf ("Slope thing at (%f,%f) lies directly on its target line.\n", pos.X, pos.Y);
				return;
			}
			cross /= len;

			// Fix backward normals
			if ((cross.Z < 0 && which == 0) || (cross.Z > 0 && which == 1))
			{
				cross = -cross;
			}

			double dist = -cross[0] * pos.X - cross[1] * pos.Y - cross[2] * pos.Z;
			srcplane->set(cross[0], cross[1], cross[2], dist);
			return;
		}
	}
}